

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O3

int secp256k1_jacobi32_maybe_var(secp256k1_modinv32_signed30 *x,secp256k1_modinv32_modinfo *modinfo)

{
  secp256k1_scalar *a;
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  int extraout_EAX_03;
  uint32_t uVar5;
  int extraout_EAX_04;
  long lVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  secp256k1_modinv32_signed30 *b;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  long lVar13;
  secp256k1_modinv32_signed30 *a_00;
  int *extraout_RDX;
  uint *extraout_RDX_00;
  int32_t *piVar14;
  long lVar15;
  secp256k1_modinv32_signed30 *b_00;
  ulong uVar16;
  long *extraout_RDX_01;
  uint uVar17;
  uint uVar18;
  secp256k1_modinv32_modinfo *unaff_RBX;
  secp256k1_modinv32_modinfo *psVar19;
  secp256k1_modinv32_modinfo *psVar20;
  int *piVar21;
  secp256k1_modinv32_signed30 *psVar22;
  ulong unaff_RBP;
  ulong uVar23;
  uint64_t uVar24;
  uint uVar25;
  secp256k1_modinv32_signed30 *psVar26;
  secp256k1_fe *psVar27;
  ulong uVar28;
  secp256k1_fe *r;
  uint uVar29;
  secp256k1_modinv32_modinfo *psVar30;
  secp256k1_modinv32_signed30 *a_01;
  secp256k1_modinv32_signed30 *a_02;
  long lVar31;
  ulong uVar32;
  secp256k1_fe *r_00;
  secp256k1_fe *psVar33;
  uchar *__s;
  uint uVar34;
  ulong uVar35;
  uint uVar36;
  secp256k1_modinv32_modinfo *psVar37;
  int *piVar38;
  uint uVar39;
  secp256k1_modinv32_modinfo *unaff_R12;
  ulong uVar40;
  secp256k1_modinv32_signed30 *psVar41;
  uint uVar42;
  secp256k1_modinv32_modinfo *unaff_R13;
  secp256k1_modinv32_modinfo *psVar43;
  secp256k1_modinv32_signed30 *psVar44;
  uint64_t uVar45;
  size_t count;
  uint uVar46;
  secp256k1_modinv32_modinfo *unaff_R14;
  secp256k1_modinv32_modinfo *psVar47;
  uint64_t uVar48;
  secp256k1_fe *a_03;
  uint uVar49;
  uint uVar50;
  secp256k1_modinv32_modinfo *unaff_R15;
  secp256k1_modinv32_modinfo *psVar51;
  uint64_t uVar52;
  code *pcVar53;
  bool bVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  secp256k1_modinv32_trans2x2 t;
  secp256k1_modinv32_signed30 g;
  secp256k1_modinv32_signed30 f;
  ulong uStack_1648;
  secp256k1_fe *psStack_1640;
  uchar auStack_1638 [4232];
  secp256k1_fe *psStack_5b0;
  ulong uStack_5a8;
  uint64_t uStack_5a0;
  secp256k1_fe *psStack_598;
  code *pcStack_590;
  code *pcStack_588;
  undefined1 auStack_580 [36];
  int iStack_55c;
  int iStack_558;
  int iStack_554;
  int iStack_550;
  int iStack_54c;
  int iStack_548;
  int iStack_544;
  undefined1 auStack_540 [48];
  code *pcStack_510;
  long lStack_500;
  secp256k1_fe sStack_4f8;
  secp256k1_fe *psStack_4c0;
  secp256k1_fe sStack_4b8;
  secp256k1_fe sStack_488;
  ulong uStack_450;
  ulong uStack_448;
  ulong uStack_440;
  secp256k1_modinv32_signed30 *psStack_438;
  ulong uStack_430;
  code *pcStack_428;
  uint uStack_420;
  uint uStack_41c;
  uint uStack_418;
  uint uStack_414;
  uint uStack_410;
  uint uStack_40c;
  secp256k1_modinv32_signed30 *psStack_408;
  uint uStack_3fc;
  uint uStack_3f8;
  uint uStack_3f4;
  uint uStack_3f0;
  int32_t iStack_3ec;
  secp256k1_modinv32_signed30 *psStack_3e8;
  secp256k1_modinv32_signed30 *psStack_3e0;
  secp256k1_modinv32_signed30 *psStack_3d8;
  secp256k1_modinv32_signed30 *psStack_3d0;
  secp256k1_modinv32_signed30 *psStack_3c8;
  code *pcStack_3c0;
  long lStack_3b0;
  long lStack_3a8;
  int *piStack_3a0;
  ulong uStack_398;
  secp256k1_modinv32_modinfo *psStack_390;
  secp256k1_modinv32_modinfo *psStack_380;
  code *pcStack_378;
  secp256k1_modinv32_signed30 *psStack_370;
  int *piStack_360;
  ulong uStack_358;
  secp256k1_modinv32_modinfo *psStack_350;
  secp256k1_modinv32_modinfo *psStack_340;
  code *pcStack_338;
  secp256k1_modinv32_signed30 sStack_330;
  secp256k1_modinv32_signed30 sStack_30c;
  secp256k1_modinv32_modinfo *psStack_2e8;
  secp256k1_modinv32_modinfo *psStack_2e0;
  secp256k1_modinv32_modinfo *psStack_2d0;
  int iStack_2c4;
  uint uStack_2c0;
  uint uStack_2bc;
  secp256k1_modinv32_trans2x2 sStack_2b8;
  secp256k1_modinv32_modinfo sStack_2a8;
  secp256k1_modinv32_modinfo *psStack_280;
  long lStack_278;
  undefined8 uStack_270;
  secp256k1_modinv32_modinfo sStack_268;
  undefined1 auStack_238 [40];
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 uStack_200;
  undefined8 uStack_1f8;
  secp256k1_modinv32_modinfo *psStack_1f0;
  ulong uStack_1e8;
  secp256k1_modinv32_modinfo *psStack_1e0;
  secp256k1_modinv32_modinfo *psStack_1d8;
  secp256k1_modinv32_modinfo *psStack_1d0;
  secp256k1_modinv32_modinfo *psStack_1c8;
  int iStack_1bc;
  secp256k1_modinv32_modinfo *psStack_1b8;
  secp256k1_modinv32_trans2x2 sStack_1b0;
  secp256k1_modinv32_modinfo sStack_1a0;
  secp256k1_modinv32_modinfo *psStack_170;
  undefined8 uStack_168;
  secp256k1_modinv32_modinfo sStack_160;
  undefined1 auStack_130 [40];
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  secp256k1_modinv32_modinfo *psStack_e8;
  secp256k1_modinv32_modinfo *psStack_e0;
  secp256k1_modinv32_modinfo *psStack_d8;
  secp256k1_modinv32_modinfo *psStack_d0;
  secp256k1_modinv32_modinfo *psStack_c8;
  code *pcStack_c0;
  secp256k1_modinv32_modinfo *local_b8;
  int local_b0;
  uint local_ac;
  secp256k1_modinv32_trans2x2 local_a8;
  secp256k1_modinv32_modinfo local_98;
  int iStack_6c;
  secp256k1_modinv32_modinfo local_68;
  secp256k1_modinv32_modinfo *local_38;
  
  local_68.modulus.v[8] = (modinfo->modulus).v[8];
  local_68.modulus.v._0_8_ = *(undefined8 *)(modinfo->modulus).v;
  local_68.modulus.v._8_8_ = *(undefined8 *)((modinfo->modulus).v + 2);
  local_68.modulus.v._16_8_ = *(undefined8 *)((modinfo->modulus).v + 4);
  local_68.modulus.v._24_8_ = *(undefined8 *)((modinfo->modulus).v + 6);
  local_98.modulus.v._8_8_ = *(undefined8 *)(x->v + 2);
  local_98.modulus.v._16_8_ = *(undefined8 *)(x->v + 4);
  local_98.modulus.v._24_8_ = *(undefined8 *)(x->v + 6);
  local_98.modulus.v[0] = (int32_t)*(undefined8 *)x->v;
  local_98.modulus.v[1] = (int32_t)((ulong)*(undefined8 *)x->v >> 0x20);
  local_98.modulus.v[8] = x->v[8];
  auVar58 = packssdw(*(undefined1 (*) [16])x->v,*(undefined1 (*) [16])(x->v + 4));
  if (((((((((auVar58 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar58 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar58 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar58 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar58 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar58 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar58 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar58[0xf]) &&
     (-1 < local_98.modulus.v[8])) {
    uVar25 = local_98.modulus.v[3] | local_98.modulus.v[2] |
             local_98.modulus.v[1] | local_98.modulus.v[0];
    psVar51 = (secp256k1_modinv32_modinfo *)(ulong)uVar25;
    psVar30 = unaff_R12;
    psVar20 = modinfo;
    if ((local_98.modulus.v[7] != 0 ||
        ((local_98.modulus.v[6] != 0 || (local_98.modulus.v[5] != 0 || local_98.modulus.v[4] != 0))
        || uVar25 != 0)) || local_98.modulus.v[8] != 0) {
      local_b8 = (secp256k1_modinv32_modinfo *)0x9;
      unaff_RBP = 0xffffffff;
      local_b0 = 0;
      unaff_RBX = (secp256k1_modinv32_modinfo *)(local_68.modulus.v._0_8_ & 0xffffffff);
      unaff_R15 = (secp256k1_modinv32_modinfo *)0x0;
      local_38 = modinfo;
      do {
        psVar20 = local_38;
        psVar30 = local_b8;
        local_ac = local_98.modulus.v[1] << 0x1e | local_98.modulus.v[0];
        uVar39 = local_68.modulus.v[1] << 0x1e | (uint)unaff_RBX;
        unaff_R12 = (secp256k1_modinv32_modinfo *)(ulong)uVar39;
        uVar25 = 1;
        psVar51 = (secp256k1_modinv32_modinfo *)0x0;
        uVar3 = 0x1e;
        x = (secp256k1_modinv32_signed30 *)0x0;
        uVar34 = 1;
        unaff_RBX = unaff_R12;
        uVar36 = local_ac;
        while( true ) {
          unaff_R14 = unaff_R15;
          modinfo = (secp256k1_modinv32_modinfo *)(ulong)local_ac;
          unaff_R13 = &local_98;
          uVar42 = (uint)unaff_RBX;
          uVar17 = -1 << ((byte)uVar3 & 0x1f) | uVar36;
          uVar8 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
            }
          }
          bVar7 = (byte)uVar8;
          uVar36 = uVar36 >> (bVar7 & 0x1f);
          uVar34 = uVar34 << (bVar7 & 0x1f);
          uVar29 = (int)x << (bVar7 & 0x1f);
          x = (secp256k1_modinv32_signed30 *)(ulong)uVar29;
          uVar17 = (int)unaff_RBP - uVar8;
          unaff_RBP = (ulong)uVar17;
          psVar19 = (secp256k1_modinv32_modinfo *)((ulong)unaff_RBX >> 1);
          uVar49 = ((uint)((ulong)unaff_RBX >> 2) ^ (uint)psVar19) & uVar8 ^ (uint)unaff_R14;
          unaff_R15 = (secp256k1_modinv32_modinfo *)(ulong)uVar49;
          uVar3 = uVar3 - uVar8;
          uVar8 = (uint)psVar51;
          if (uVar3 == 0) break;
          if (((ulong)unaff_RBX & 1) == 0) {
            pcStack_c0 = (code *)0x14ace2;
            secp256k1_jacobi32_maybe_var_cold_6();
LAB_0014ace2:
            pcStack_c0 = (code *)0x14ace7;
            secp256k1_jacobi32_maybe_var_cold_5();
LAB_0014ace7:
            pcStack_c0 = (code *)0x14acec;
            secp256k1_jacobi32_maybe_var_cold_1();
LAB_0014acec:
            unaff_RBX = psVar19;
            pcStack_c0 = (code *)0x14acf1;
            secp256k1_jacobi32_maybe_var_cold_2();
            psVar51 = unaff_R12;
LAB_0014acf1:
            unaff_R12 = psVar51;
            pcStack_c0 = (code *)0x14acf6;
            secp256k1_jacobi32_maybe_var_cold_4();
            goto LAB_0014acf6;
          }
          if ((uVar36 & 1) == 0) goto LAB_0014ace2;
          uVar18 = uVar29 * local_ac + uVar34 * uVar39;
          psVar19 = (secp256k1_modinv32_modinfo *)(ulong)uVar18;
          bVar7 = 0x1e - (char)uVar3;
          uVar46 = uVar42 << (bVar7 & 0x1f);
          unaff_R14 = (secp256k1_modinv32_modinfo *)(ulong)uVar46;
          if (uVar18 != uVar46) goto LAB_0014ace7;
          uVar46 = uVar25 * local_ac + uVar8 * uVar39;
          unaff_R14 = (secp256k1_modinv32_modinfo *)(ulong)uVar46;
          uVar18 = uVar36 << (bVar7 & 0x1f);
          psVar19 = (secp256k1_modinv32_modinfo *)(ulong)uVar18;
          if (uVar46 != uVar18) goto LAB_0014acec;
          unaff_R14 = psVar51;
          if ((int)uVar17 < 0) {
            unaff_RBP = (ulong)-uVar17;
            unaff_R15 = (secp256k1_modinv32_modinfo *)(ulong)(uVar49 ^ (uVar36 & uVar42) >> 1);
            unaff_RBX = (secp256k1_modinv32_modinfo *)(ulong)uVar36;
            x = (secp256k1_modinv32_signed30 *)(ulong)uVar25;
            unaff_R14 = (secp256k1_modinv32_modinfo *)(ulong)uVar34;
            uVar34 = uVar8;
            uVar36 = uVar42;
            uVar25 = uVar29;
          }
          uVar8 = (int)unaff_RBP + 1;
          if ((int)uVar3 <= (int)uVar8) {
            uVar8 = uVar3;
          }
          modinfo = unaff_R12;
          psVar51 = (secp256k1_modinv32_modinfo *)(ulong)uVar25;
          if (0x1e < uVar8) goto LAB_0014acf1;
          uVar42 = (uint)(0xff << (-(char)uVar8 & 0x1fU)) >> (-(char)uVar8 & 0x1fU);
          uVar8 = secp256k1_modinv32_inv256[(uint)((ulong)unaff_RBX >> 1) & 0x7f] * uVar36 & uVar42;
          uVar36 = uVar8 * (int)unaff_RBX + uVar36;
          psVar51 = (secp256k1_modinv32_modinfo *)(ulong)(uVar8 * uVar34 + (int)unaff_R14);
          uVar25 = uVar8 * (int)x + uVar25;
          modinfo = (secp256k1_modinv32_modinfo *)(ulong)local_ac;
          if ((uVar36 & uVar42) != 0) {
LAB_0014acf6:
            unaff_R13 = &local_98;
            pcStack_c0 = (code *)0x14acfb;
            secp256k1_jacobi32_maybe_var_cold_3();
            goto LAB_0014acfb;
          }
        }
        lVar6 = (long)(int)uVar25 * (long)(int)uVar34 - (long)(int)uVar8 * (long)(int)uVar29;
        unaff_RBX = &local_68;
        local_a8.u = uVar34;
        local_a8.v = uVar29;
        local_a8.q = uVar8;
        local_a8.r = uVar25;
        if ((lVar6 != -0x40000000) && (lVar6 != 0x40000000)) goto LAB_0014ad2d;
        iVar9 = (int)local_b8;
        modinfo = (secp256k1_modinv32_modinfo *)((ulong)local_b8 & 0xffffffff);
        pcStack_c0 = (code *)0x14ab7f;
        x = &unaff_RBX->modulus;
        iVar4 = secp256k1_modinv32_mul_cmp_30(&unaff_RBX->modulus,iVar9,&local_38->modulus,0);
        if (iVar4 < 1) goto LAB_0014ad00;
        modinfo = (secp256k1_modinv32_modinfo *)((ulong)psVar30 & 0xffffffff);
        pcStack_c0 = (code *)0x14ab9a;
        x = &unaff_RBX->modulus;
        iVar4 = secp256k1_modinv32_mul_cmp_30(&unaff_RBX->modulus,iVar9,&psVar20->modulus,1);
        if (0 < iVar4) goto LAB_0014ad05;
        modinfo = (secp256k1_modinv32_modinfo *)((ulong)psVar30 & 0xffffffff);
        pcStack_c0 = (code *)0x14abb2;
        x = &unaff_R13->modulus;
        iVar4 = secp256k1_modinv32_mul_cmp_30(&unaff_R13->modulus,iVar9,&psVar20->modulus,0);
        if (iVar4 < 1) goto LAB_0014ad0a;
        modinfo = (secp256k1_modinv32_modinfo *)((ulong)psVar30 & 0xffffffff);
        pcStack_c0 = (code *)0x14abcd;
        x = &unaff_R13->modulus;
        iVar4 = secp256k1_modinv32_mul_cmp_30(&unaff_R13->modulus,iVar9,&psVar20->modulus,1);
        if (-1 < iVar4) goto LAB_0014ad0f;
        pcStack_c0 = (code *)0x14abe8;
        secp256k1_modinv32_update_fg_30_var(iVar9,&unaff_RBX->modulus,&unaff_R13->modulus,&local_a8)
        ;
        unaff_RBX = (secp256k1_modinv32_modinfo *)(local_68.modulus.v._0_8_ & 0xffffffff);
        if (local_68.modulus.v[0] == 1) {
          if (iVar9 < 2) {
LAB_0014acbc:
            return 1 - (uVar49 * 2 & 2);
          }
          uVar25 = 0;
          uVar40 = 1;
          do {
            uVar25 = uVar25 | local_68.modulus.v[uVar40];
            uVar40 = uVar40 + 1;
          } while (((ulong)psVar30 & 0xffffffff) != uVar40);
          psVar30 = local_b8;
          if (uVar25 == 0) goto LAB_0014acbc;
        }
        iVar4 = (int)psVar30;
        psVar30 = (secp256k1_modinv32_modinfo *)((ulong)psVar30 & 0xffffffff);
        if ((-1 < iVar4 + -2 && (&iStack_6c)[iVar4] == 0) &&
            local_98.modulus.v[(long)iVar4 + -1] == 0) {
          psVar30 = (secp256k1_modinv32_modinfo *)(ulong)(iVar4 - 1);
        }
        unaff_R13 = &local_68;
        pcStack_c0 = (code *)0x14ac4e;
        iVar9 = (int)psVar30;
        modinfo = psVar30;
        x = &unaff_R13->modulus;
        iVar4 = secp256k1_modinv32_mul_cmp_30(&unaff_R13->modulus,iVar9,&psVar20->modulus,0);
        if (iVar4 < 1) goto LAB_0014ad14;
        pcStack_c0 = (code *)0x14ac69;
        modinfo = psVar30;
        x = &unaff_R13->modulus;
        iVar4 = secp256k1_modinv32_mul_cmp_30(&unaff_R13->modulus,iVar9,&psVar20->modulus,1);
        if (0 < iVar4) goto LAB_0014ad19;
        unaff_R13 = &local_98;
        pcStack_c0 = (code *)0x14ac86;
        modinfo = psVar30;
        x = &unaff_R13->modulus;
        iVar4 = secp256k1_modinv32_mul_cmp_30(&unaff_R13->modulus,iVar9,&psVar20->modulus,0);
        if (iVar4 < 1) goto LAB_0014ad1e;
        pcStack_c0 = (code *)0x14aca5;
        modinfo = psVar30;
        x = &unaff_R13->modulus;
        local_b8 = psVar30;
        iVar4 = secp256k1_modinv32_mul_cmp_30(&unaff_R13->modulus,iVar9,&psVar20->modulus,1);
        if (-1 < iVar4) goto LAB_0014ad23;
        local_b0 = local_b0 + 1;
        if (local_b0 == 0x19) {
          return 0;
        }
      } while( true );
    }
  }
  else {
LAB_0014acfb:
    pcStack_c0 = (code *)0x14ad00;
    secp256k1_jacobi32_maybe_var_cold_17();
    psVar30 = unaff_R12;
    psVar20 = unaff_R14;
LAB_0014ad00:
    pcStack_c0 = (code *)0x14ad05;
    secp256k1_jacobi32_maybe_var_cold_14();
LAB_0014ad05:
    pcStack_c0 = (code *)0x14ad0a;
    secp256k1_jacobi32_maybe_var_cold_13();
LAB_0014ad0a:
    pcStack_c0 = (code *)0x14ad0f;
    secp256k1_jacobi32_maybe_var_cold_12();
LAB_0014ad0f:
    pcStack_c0 = (code *)0x14ad14;
    secp256k1_jacobi32_maybe_var_cold_11();
LAB_0014ad14:
    pcStack_c0 = (code *)0x14ad19;
    secp256k1_jacobi32_maybe_var_cold_10();
LAB_0014ad19:
    pcStack_c0 = (code *)0x14ad1e;
    secp256k1_jacobi32_maybe_var_cold_9();
LAB_0014ad1e:
    pcStack_c0 = (code *)0x14ad23;
    secp256k1_jacobi32_maybe_var_cold_8();
LAB_0014ad23:
    pcStack_c0 = (code *)0x14ad28;
    secp256k1_jacobi32_maybe_var_cold_7();
    psVar51 = modinfo;
  }
  modinfo = psVar51;
  pcStack_c0 = (code *)0x14ad2d;
  secp256k1_jacobi32_maybe_var_cold_16();
LAB_0014ad2d:
  pcStack_c0 = secp256k1_modinv32_var;
  secp256k1_jacobi32_maybe_var_cold_15();
  pcStack_c0 = (code *)unaff_RBP;
  psStack_c8 = unaff_R15;
  psStack_d0 = psVar20;
  psStack_d8 = unaff_R13;
  psStack_e0 = psVar30;
  psStack_e8 = unaff_RBX;
  auStack_130._16_4_ = 0;
  auStack_130._20_4_ = 0;
  auStack_130._24_4_ = 0;
  auStack_130._28_4_ = 0;
  auStack_130._0_4_ = 0;
  auStack_130._4_4_ = 0;
  auStack_130._8_4_ = 0;
  auStack_130._12_4_ = 0;
  auStack_130._32_4_ = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_108 = 0;
  uStack_100 = 0;
  auStack_130._36_4_ = 1;
  sStack_1a0.modulus.v[8] = (modinfo->modulus).v[8];
  uStack_168 = modinfo;
  sStack_1a0.modulus.v._16_8_ = *(undefined8 *)((modinfo->modulus).v + 4);
  sStack_1a0.modulus.v._24_8_ = *(undefined8 *)((modinfo->modulus).v + 6);
  sStack_1a0.modulus.v._0_8_ = *(ulong *)(modinfo->modulus).v;
  sStack_1a0.modulus.v._8_8_ = *(undefined8 *)((modinfo->modulus).v + 2);
  sStack_160.modulus.v[8] = (((secp256k1_modinv32_modinfo *)x)->modulus).v[8];
  sStack_160.modulus.v._0_8_ = *(undefined8 *)(((secp256k1_modinv32_modinfo *)x)->modulus).v;
  sStack_160.modulus.v._8_8_ = *(undefined8 *)((((secp256k1_modinv32_modinfo *)x)->modulus).v + 2);
  psStack_170 = (secp256k1_modinv32_modinfo *)x;
  sStack_160.modulus.v._16_8_ = *(undefined8 *)((((secp256k1_modinv32_modinfo *)x)->modulus).v + 4);
  sStack_160.modulus.v._24_8_ = *(undefined8 *)((((secp256k1_modinv32_modinfo *)x)->modulus).v + 6);
  iStack_1bc = 0;
  uVar40 = 0xffffffff;
  psStack_1b8 = (secp256k1_modinv32_modinfo *)0x9;
LAB_0014adc7:
  psVar20 = uStack_168;
  psVar51 = psStack_1b8;
  psVar43 = (secp256k1_modinv32_modinfo *)(sStack_1a0.modulus.v._0_8_ & 0xffffffff);
  psVar30 = (secp256k1_modinv32_modinfo *)(sStack_160.modulus.v._0_8_ & 0xffffffff);
  uVar25 = 1;
  psVar37 = (secp256k1_modinv32_modinfo *)0x0;
  iVar4 = 0x1e;
  uVar3 = 0;
  psVar19 = (secp256k1_modinv32_modinfo *)0x1;
  uVar34 = sStack_1a0.modulus.v[0];
  uVar36 = sStack_160.modulus.v[0];
  while( true ) {
    uVar39 = -1 << ((byte)iVar4 & 0x1f) | uVar36;
    iVar9 = 0;
    if (uVar39 != 0) {
      for (; (uVar39 >> iVar9 & 1) == 0; iVar9 = iVar9 + 1) {
      }
    }
    bVar7 = (byte)iVar9;
    uVar36 = uVar36 >> (bVar7 & 0x1f);
    uVar8 = (int)psVar19 << (bVar7 & 0x1f);
    psVar19 = (secp256k1_modinv32_modinfo *)(ulong)uVar8;
    uVar3 = uVar3 << (bVar7 & 0x1f);
    uVar42 = (int)uVar40 - iVar9;
    uVar40 = (ulong)uVar42;
    iVar4 = iVar4 - iVar9;
    iVar9 = (int)psVar37;
    if (iVar4 == 0) break;
    if ((uVar34 & 1) == 0) {
      psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b1ee;
      secp256k1_modinv32_var_cold_7();
LAB_0014b1ee:
      psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b1f3;
      secp256k1_modinv32_var_cold_6();
LAB_0014b1f3:
      psVar47 = (secp256k1_modinv32_modinfo *)(ulong)uVar39;
      psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b1f8;
      secp256k1_modinv32_var_cold_1();
LAB_0014b1f8:
      psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b1fd;
      secp256k1_modinv32_var_cold_2();
LAB_0014b1fd:
      psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b202;
      secp256k1_modinv32_var_cold_5();
LAB_0014b202:
      psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b207;
      secp256k1_modinv32_var_cold_4();
      goto LAB_0014b207;
    }
    if ((uVar36 & 1) == 0) goto LAB_0014b1ee;
    uVar39 = uVar3 * sStack_160.modulus.v[0] + uVar8 * sStack_1a0.modulus.v[0];
    bVar7 = 0x1e - (char)iVar4;
    uVar17 = uVar34 << (bVar7 & 0x1f);
    unaff_R13 = (secp256k1_modinv32_modinfo *)(ulong)uVar17;
    if (uVar39 != uVar17) goto LAB_0014b1f3;
    uVar39 = uVar25 * sStack_160.modulus.v[0] + iVar9 * sStack_1a0.modulus.v[0];
    unaff_R13 = (secp256k1_modinv32_modinfo *)(ulong)uVar39;
    uVar17 = uVar36 << (bVar7 & 0x1f);
    psVar47 = (secp256k1_modinv32_modinfo *)(ulong)uVar17;
    if (uVar39 != uVar17) goto LAB_0014b1f8;
    if (uVar42 - 0x2f0 < 0xfffffa21) goto LAB_0014b1fd;
    psVar47 = psVar37;
    if ((int)uVar42 < 0) {
      uVar40 = (ulong)-uVar42;
      uVar39 = -uVar34;
      uVar42 = -uVar3;
      psVar19 = psVar37;
      psVar47 = (secp256k1_modinv32_modinfo *)(ulong)-uVar8;
      uVar34 = uVar36;
      uVar36 = uVar39;
      uVar3 = uVar25;
      uVar25 = uVar42;
    }
    unaff_R13 = (secp256k1_modinv32_modinfo *)(ulong)uVar25;
    iVar9 = (int)uVar40 + 1;
    if (iVar4 <= iVar9) {
      iVar9 = iVar4;
    }
    if (iVar9 - 0x1fU < 0xffffffe2) goto LAB_0014b202;
    uVar8 = (uint)(0xff << (-(char)iVar9 & 0x1fU)) >> (-(char)iVar9 & 0x1fU);
    unaff_R15 = (secp256k1_modinv32_modinfo *)(ulong)uVar8;
    uVar39 = secp256k1_modinv32_inv256[uVar34 >> 1 & 0x7f] * uVar36 & uVar8;
    uVar36 = uVar36 + uVar39 * uVar34;
    psVar37 = (secp256k1_modinv32_modinfo *)(ulong)(uVar39 * (int)psVar19 + (int)psVar47);
    uVar25 = uVar39 * uVar3 + uVar25;
    if ((uVar36 & uVar8) != 0) {
LAB_0014b207:
      psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b20c;
      secp256k1_modinv32_var_cold_3();
      psVar51 = psVar47;
      goto LAB_0014b20c;
    }
  }
  sStack_1b0.u = uVar8;
  sStack_1b0.v = uVar3;
  sStack_1b0.q = iVar9;
  sStack_1b0.r = uVar25;
  if ((long)(int)uVar25 * (long)(int)uVar8 - (long)iVar9 * (long)(int)uVar3 == 0x40000000) {
    psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14af6d;
    secp256k1_modinv32_update_de_30
              ((secp256k1_modinv32_signed30 *)auStack_130,
               (secp256k1_modinv32_signed30 *)(auStack_130 + 0x24),&sStack_1b0,uStack_168);
    unaff_R15 = &sStack_1a0;
    iVar9 = (int)psVar51;
    psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14af85;
    psVar43 = psVar51;
    psVar30 = unaff_R15;
    iVar4 = secp256k1_modinv32_mul_cmp_30(&unaff_R15->modulus,iVar9,&psVar20->modulus,-1);
    if (iVar4 < 1) goto LAB_0014b211;
    psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14afa0;
    psVar43 = psVar51;
    psVar30 = unaff_R15;
    iVar4 = secp256k1_modinv32_mul_cmp_30(&unaff_R15->modulus,iVar9,&psVar20->modulus,1);
    if (0 < iVar4) goto LAB_0014b216;
    psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14afbb;
    psVar43 = psVar51;
    psVar30 = &sStack_160;
    iVar4 = secp256k1_modinv32_mul_cmp_30(&sStack_160.modulus,iVar9,&psVar20->modulus,-1);
    if (iVar4 < 1) goto LAB_0014b21b;
    psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14afd6;
    psVar43 = psVar51;
    psVar30 = &sStack_160;
    iVar4 = secp256k1_modinv32_mul_cmp_30(&sStack_160.modulus,iVar9,&psVar20->modulus,1);
    if (-1 < iVar4) goto LAB_0014b220;
    psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14aff3;
    secp256k1_modinv32_update_fg_30_var(iVar9,&sStack_1a0.modulus,&sStack_160.modulus,&sStack_1b0);
    if (sStack_160.modulus.v[0] == 0) {
      if (1 < iVar9) {
        uVar25 = 0;
        psVar30 = (secp256k1_modinv32_modinfo *)0x1;
        do {
          uVar25 = uVar25 | sStack_160.modulus.v[(long)psVar30];
          psVar30 = (secp256k1_modinv32_modinfo *)((long)(psVar30->modulus).v + 1);
        } while (psVar51 != psVar30);
        if (uVar25 != 0) goto LAB_0014b022;
      }
      psVar30 = &sStack_160;
      psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b0fe;
      psVar43 = psVar51;
      iVar4 = secp256k1_modinv32_mul_cmp_30(&psVar30->modulus,iVar9,&SECP256K1_SIGNED30_ONE,0);
      psVar19 = psVar51;
      if (iVar4 != 0) goto LAB_0014b23e;
      psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b11f;
      iVar4 = secp256k1_modinv32_mul_cmp_30(&sStack_1a0.modulus,iVar9,&SECP256K1_SIGNED30_ONE,-1);
      psVar19 = psStack_170;
      if (iVar4 != 0) {
        psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b144;
        iVar4 = secp256k1_modinv32_mul_cmp_30(&sStack_1a0.modulus,iVar9,&SECP256K1_SIGNED30_ONE,1);
        if (iVar4 != 0) {
          psVar43 = (secp256k1_modinv32_modinfo *)0x9;
          psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b15e;
          psVar30 = psVar19;
          iVar4 = secp256k1_modinv32_mul_cmp_30(&psVar19->modulus,9,&SECP256K1_SIGNED30_ONE,0);
          if (iVar4 != 0) goto LAB_0014b243;
          psVar30 = (secp256k1_modinv32_modinfo *)auStack_130;
          psVar43 = (secp256k1_modinv32_modinfo *)0x9;
          psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b181;
          iVar4 = secp256k1_modinv32_mul_cmp_30
                            ((secp256k1_modinv32_signed30 *)psVar30,9,&SECP256K1_SIGNED30_ONE,0);
          if (iVar4 != 0) goto LAB_0014b243;
          psVar30 = &sStack_1a0;
          psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b19e;
          psVar43 = psVar51;
          iVar4 = secp256k1_modinv32_mul_cmp_30(&psVar30->modulus,iVar9,&psVar20->modulus,1);
          if (iVar4 != 0) goto LAB_0014b243;
        }
      }
      psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b1c0;
      secp256k1_modinv32_normalize_30
                ((secp256k1_modinv32_signed30 *)auStack_130,sStack_1a0.modulus.v[(long)iVar9 + -1],
                 psVar20);
      (psVar19->modulus).v[8] = auStack_130._32_4_;
      *(undefined8 *)((psVar19->modulus).v + 4) = auStack_130._16_8_;
      *(undefined8 *)((psVar19->modulus).v + 6) = auStack_130._24_8_;
      *(undefined8 *)(psVar19->modulus).v = auStack_130._0_8_;
      *(undefined8 *)((psVar19->modulus).v + 2) = auStack_130._8_8_;
      return auStack_130._32_4_;
    }
LAB_0014b022:
    uVar25 = sStack_1a0.modulus.v[(long)iVar9 + -1];
    uVar34 = *(uint *)((long)&uStack_168 + (long)iVar9 * 4 + 4);
    iVar4 = iVar9 + -2;
    uVar36 = (int)uVar25 >> 0x1f ^ uVar25 | iVar4 >> 0x1f;
    psVar30 = (secp256k1_modinv32_modinfo *)(ulong)uVar36;
    uVar36 = (int)uVar34 >> 0x1f ^ uVar34 | uVar36;
    psVar43 = (secp256k1_modinv32_modinfo *)(ulong)uVar36;
    if (uVar36 == 0) {
      psVar51 = (secp256k1_modinv32_modinfo *)(ulong)(iVar9 - 1);
      piVar14 = sStack_1a0.modulus.v + iVar4;
      *piVar14 = *piVar14 | uVar25 << 0x1e;
      piVar14 = sStack_160.modulus.v + iVar4;
      *piVar14 = *piVar14 | uVar34 << 0x1e;
    }
    unaff_R15 = &sStack_1a0;
    if (iStack_1bc == 0x18) goto LAB_0014b225;
    iVar9 = (int)psVar51;
    psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b081;
    psVar43 = psVar51;
    psVar30 = unaff_R15;
    iVar4 = secp256k1_modinv32_mul_cmp_30(&unaff_R15->modulus,iVar9,&psVar20->modulus,-1);
    if (iVar4 < 1) goto LAB_0014b22a;
    psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b09c;
    psVar43 = psVar51;
    psVar30 = unaff_R15;
    iVar4 = secp256k1_modinv32_mul_cmp_30(&unaff_R15->modulus,iVar9,&psVar20->modulus,1);
    if (0 < iVar4) goto LAB_0014b22f;
    psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b0b7;
    psVar43 = psVar51;
    psVar30 = &sStack_160;
    iVar4 = secp256k1_modinv32_mul_cmp_30(&sStack_160.modulus,iVar9,&psVar20->modulus,-1);
    if (iVar4 < 1) goto LAB_0014b234;
    psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b0d2;
    psVar43 = psVar51;
    psVar30 = &sStack_160;
    iVar4 = secp256k1_modinv32_mul_cmp_30(&sStack_160.modulus,iVar9,&psVar20->modulus,1);
    if (-1 < iVar4) goto LAB_0014b239;
    iStack_1bc = iStack_1bc + 1;
    psStack_1b8 = psVar51;
    goto LAB_0014adc7;
  }
LAB_0014b20c:
  psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b211;
  secp256k1_modinv32_var_cold_8();
  psVar20 = psVar19;
LAB_0014b211:
  psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b216;
  secp256k1_modinv32_var_cold_19();
LAB_0014b216:
  psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b21b;
  secp256k1_modinv32_var_cold_18();
LAB_0014b21b:
  psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b220;
  secp256k1_modinv32_var_cold_17();
LAB_0014b220:
  psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b225;
  secp256k1_modinv32_var_cold_16();
LAB_0014b225:
  psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b22a;
  secp256k1_modinv32_var_cold_13();
LAB_0014b22a:
  psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b22f;
  secp256k1_modinv32_var_cold_12();
LAB_0014b22f:
  psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b234;
  secp256k1_modinv32_var_cold_11();
LAB_0014b234:
  psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b239;
  secp256k1_modinv32_var_cold_10();
LAB_0014b239:
  psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b23e;
  secp256k1_modinv32_var_cold_9();
  psVar19 = psVar51;
LAB_0014b23e:
  psVar51 = unaff_R15;
  psStack_1c8 = (secp256k1_modinv32_modinfo *)0x14b243;
  secp256k1_modinv32_var_cold_14();
LAB_0014b243:
  psStack_1c8 = (secp256k1_modinv32_modinfo *)secp256k1_modinv32;
  secp256k1_modinv32_var_cold_15();
  psStack_1c8 = &sStack_160;
  psStack_1d0 = psVar51;
  psStack_1d8 = psVar19;
  psStack_1e0 = unaff_R13;
  uStack_1e8 = uVar40;
  psStack_1f0 = psVar20;
  auStack_238._16_4_ = 0;
  auStack_238._20_4_ = 0;
  auStack_238._24_4_ = 0;
  auStack_238._28_4_ = 0;
  auStack_238._0_4_ = 0;
  auStack_238._4_4_ = 0;
  auStack_238._8_4_ = 0;
  auStack_238._12_4_ = 0;
  auStack_238._32_4_ = 0;
  uStack_200 = 0;
  uStack_1f8 = 0;
  uStack_210 = 0;
  uStack_208 = 0;
  auStack_238._36_4_ = 1;
  sStack_2a8.modulus.v[8] = (psVar43->modulus).v[8];
  sStack_2a8.modulus.v._16_8_ = *(undefined8 *)((psVar43->modulus).v + 4);
  sStack_2a8.modulus.v._24_8_ = *(undefined8 *)((psVar43->modulus).v + 6);
  sStack_2a8.modulus.v._0_8_ = *(undefined8 *)(psVar43->modulus).v;
  sStack_2a8.modulus.v._8_8_ = *(undefined8 *)((psVar43->modulus).v + 2);
  sStack_268.modulus.v[8] = (psVar30->modulus).v[8];
  sStack_268.modulus.v._0_8_ = *(undefined8 *)(psVar30->modulus).v;
  sStack_268.modulus.v._8_8_ = *(undefined8 *)((psVar30->modulus).v + 2);
  psStack_280 = psVar30;
  sStack_268.modulus.v._16_8_ = *(undefined8 *)((psVar30->modulus).v + 4);
  sStack_268.modulus.v._24_8_ = *(undefined8 *)((psVar30->modulus).v + 6);
  iVar4 = 0;
  uVar40 = 0xffffffff;
  psStack_2d0 = psVar43;
  do {
    uStack_270 = (ulong)sStack_2a8.modulus.v[0];
    uVar23 = (ulong)sStack_268.modulus.v[0];
    uVar11 = 0;
    psVar30 = (secp256k1_modinv32_modinfo *)0x1;
    uVar25 = 0;
    uVar3 = 0;
    uVar39 = 1;
    uVar34 = sStack_268.modulus.v[0];
    uVar36 = sStack_2a8.modulus.v[0];
    do {
      uVar8 = sStack_2a8.modulus.v[0];
      iStack_2c4 = iVar4;
      if ((uVar36 & 1) == 0) {
        psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b706;
        secp256k1_modinv32_cold_17();
LAB_0014b706:
        psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b70b;
        secp256k1_modinv32_cold_1();
LAB_0014b70b:
        psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b710;
        secp256k1_modinv32_cold_2();
        psVar43 = unaff_R13;
LAB_0014b710:
        uVar39 = uVar8;
        psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b715;
        secp256k1_modinv32_cold_16();
        goto LAB_0014b715;
      }
      uVar17 = (uint)psVar30;
      uVar29 = uVar25 * sStack_268.modulus.v[0] + uVar17 * sStack_2a8.modulus.v[0];
      psVar19 = (secp256k1_modinv32_modinfo *)(ulong)uVar29;
      uVar42 = uVar36 << ((byte)uVar11 & 0x1f);
      psVar20 = (secp256k1_modinv32_modinfo *)(ulong)uVar42;
      if (uVar29 != uVar42) goto LAB_0014b706;
      uVar29 = uVar39 * sStack_268.modulus.v[0] + uVar3 * sStack_2a8.modulus.v[0];
      psVar19 = (secp256k1_modinv32_modinfo *)(ulong)uVar29;
      uVar42 = uVar34 << ((byte)uVar11 & 0x1f);
      psVar20 = (secp256k1_modinv32_modinfo *)(ulong)uVar42;
      if (uVar29 != uVar42) goto LAB_0014b70b;
      uStack_2bc = (int)(uint)uVar40 >> 0x1f;
      psVar19 = (secp256k1_modinv32_modinfo *)(ulong)uStack_2bc;
      uStack_2c0 = uVar34 & 1;
      uVar42 = -uStack_2c0;
      psVar51 = (secp256k1_modinv32_modinfo *)(ulong)uVar42;
      uVar29 = uStack_2bc & uVar42;
      psVar20 = (secp256k1_modinv32_modinfo *)(ulong)uVar29;
      uVar49 = (uint)uVar40 ^ uVar29;
      uVar40 = (ulong)uVar49;
      psVar43 = (secp256k1_modinv32_modinfo *)(ulong)(uVar49 - 0x25b);
      if (uVar49 - 0x25b < 0xfffffb4d) goto LAB_0014b710;
      uVar40 = (ulong)(uVar49 - 1);
      uVar39 = uVar39 + ((uStack_2bc ^ uVar25) - uStack_2bc & uVar42);
      uVar25 = (uVar25 + (uVar39 & uVar29)) * 2;
      uVar3 = uVar3 + ((uStack_2bc ^ uVar17) - uStack_2bc & uVar42);
      uVar8 = (uVar17 + (uVar3 & uVar29)) * 2;
      psVar30 = (secp256k1_modinv32_modinfo *)(ulong)uVar8;
      uVar42 = ((uStack_2bc ^ uVar36) - uStack_2bc & uVar42) + uVar34;
      uVar34 = uVar42 >> 1;
      uVar42 = uVar42 & uVar29;
      unaff_R13 = (secp256k1_modinv32_modinfo *)(ulong)uVar42;
      uVar36 = uVar36 + uVar42;
      uVar42 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar42;
    } while (uVar42 != 0x1e);
    psVar19 = (secp256k1_modinv32_modinfo *)(long)(int)uVar8;
    psVar43 = (secp256k1_modinv32_modinfo *)(long)(int)uVar25;
    psVar51 = (secp256k1_modinv32_modinfo *)(long)(int)uVar3;
    uVar11 = (long)psVar19 * (long)(int)uVar39 - (long)psVar43 * (long)psVar51;
    sStack_2b8.u = uVar8;
    sStack_2b8.v = uVar25;
    sStack_2b8.q = uVar3;
    sStack_2b8.r = uVar39;
    if (uVar11 != 0x40000000) {
LAB_0014b715:
      psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b71a;
      secp256k1_modinv32_cold_3();
LAB_0014b71a:
      psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b71f;
      secp256k1_modinv32_cold_15();
LAB_0014b71f:
      psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b724;
      secp256k1_modinv32_cold_14();
LAB_0014b724:
      psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b729;
      secp256k1_modinv32_cold_13();
LAB_0014b729:
      psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b72e;
      secp256k1_modinv32_cold_12();
LAB_0014b72e:
      psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b733;
      secp256k1_modinv32_cold_4();
LAB_0014b733:
      unaff_R13 = psVar43;
      uVar25 = (uint)uVar11;
      psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b738;
      secp256k1_modinv32_cold_5();
LAB_0014b738:
      psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b73d;
      secp256k1_modinv32_cold_11();
LAB_0014b73d:
      psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b742;
      secp256k1_modinv32_cold_10();
LAB_0014b742:
      psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b747;
      secp256k1_modinv32_cold_9();
LAB_0014b747:
      psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b74c;
      secp256k1_modinv32_cold_8();
      goto LAB_0014b74c;
    }
    psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b43a;
    lStack_278 = (long)(int)uVar39;
    secp256k1_modinv32_update_de_30
              ((secp256k1_modinv32_signed30 *)auStack_238,
               (secp256k1_modinv32_signed30 *)(auStack_238 + 0x24),&sStack_2b8,psStack_2d0);
    psVar20 = &sStack_2a8;
    uVar39 = 9;
    uVar11 = 0xffffffff;
    psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b456;
    psVar30 = psVar20;
    iVar4 = secp256k1_modinv32_mul_cmp_30(&psVar20->modulus,9,&psStack_2d0->modulus,-1);
    if (iVar4 < 1) goto LAB_0014b71a;
    uVar39 = 9;
    uVar11 = 1;
    psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b475;
    psVar30 = psVar20;
    iVar4 = secp256k1_modinv32_mul_cmp_30(&psVar20->modulus,9,&psStack_2d0->modulus,1);
    if (0 < iVar4) goto LAB_0014b71f;
    psVar20 = &sStack_268;
    uVar39 = 9;
    uVar11 = 0xffffffff;
    psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b499;
    psVar30 = psVar20;
    iVar4 = secp256k1_modinv32_mul_cmp_30(&psVar20->modulus,9,&psStack_2d0->modulus,-1);
    if (iVar4 < 1) goto LAB_0014b724;
    uVar39 = 9;
    uVar11 = 1;
    psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b4b8;
    psVar30 = psVar20;
    iVar4 = secp256k1_modinv32_mul_cmp_30(&psVar20->modulus,9,&psStack_2d0->modulus,1);
    unaff_R13 = psStack_2d0;
    if (-1 < iVar4) goto LAB_0014b729;
    psVar20 = (secp256k1_modinv32_modinfo *)((long)psVar43 * uVar23 + (long)psVar19 * uStack_270);
    uVar11 = uStack_270;
    if (((ulong)psVar20 & 0x3ffffffe) != 0) goto LAB_0014b72e;
    uVar11 = uStack_270 * (long)psVar51;
    uVar23 = uVar23 * lStack_278 + uVar11;
    if ((uVar23 & 0x3fffffff) != 0) goto LAB_0014b733;
    uVar23 = (long)uVar23 >> 0x1e;
    psVar20 = (secp256k1_modinv32_modinfo *)((long)psVar20 >> 0x1e);
    lVar6 = 1;
    do {
      lVar12 = (long)sStack_2a8.modulus.v[lVar6];
      lVar13 = (long)sStack_268.modulus.v[lVar6];
      lVar15 = (long)(psVar20->modulus).v + lVar13 * (long)psVar43 + lVar12 * (long)psVar19;
      lVar12 = lVar13 * lStack_278 + lVar12 * (long)psVar51 + uVar23;
      sStack_2a8.modulus.v[lVar6 + -1] = (uint)lVar15 & 0x3fffffff;
      *(uint *)((long)&uStack_270 + lVar6 * 4 + 4) = (uint)lVar12 & 0x3fffffff;
      lVar6 = lVar6 + 1;
      uVar23 = lVar12 >> 0x1e;
      psVar20 = (secp256k1_modinv32_modinfo *)(lVar15 >> 0x1e);
    } while (lVar6 != 9);
    sStack_268.modulus.v[8] = (int32_t)uVar23;
    psVar19 = &sStack_2a8;
    uVar39 = 9;
    uVar25 = 0xffffffff;
    psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b58a;
    psVar30 = psVar19;
    sStack_2a8.modulus.v[8] = (int32_t)psVar20;
    iVar4 = secp256k1_modinv32_mul_cmp_30(&psVar19->modulus,9,&psStack_2d0->modulus,-1);
    if (iVar4 < 1) goto LAB_0014b738;
    uVar39 = 9;
    uVar25 = 1;
    psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b5a7;
    psVar30 = psVar19;
    iVar4 = secp256k1_modinv32_mul_cmp_30(&psVar19->modulus,9,&unaff_R13->modulus,1);
    if (0 < iVar4) goto LAB_0014b73d;
    psVar19 = &sStack_268;
    uVar39 = 9;
    uVar25 = 0xffffffff;
    psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b5c9;
    psVar30 = psVar19;
    iVar4 = secp256k1_modinv32_mul_cmp_30(&psVar19->modulus,9,&unaff_R13->modulus,-1);
    if (iVar4 < 1) goto LAB_0014b742;
    uVar39 = 9;
    uVar25 = 1;
    psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b5e6;
    psVar30 = psVar19;
    iVar4 = secp256k1_modinv32_mul_cmp_30(&psVar19->modulus,9,&unaff_R13->modulus,1);
    if (-1 < iVar4) goto LAB_0014b747;
    iVar4 = iStack_2c4 + 1;
  } while (iVar4 != 0x14);
  psVar30 = &sStack_268;
  uVar39 = 9;
  uVar25 = 0;
  psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b615;
  iVar4 = secp256k1_modinv32_mul_cmp_30(&psVar30->modulus,9,&SECP256K1_SIGNED30_ONE,0);
  if (iVar4 == 0) {
    psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b638;
    iVar4 = secp256k1_modinv32_mul_cmp_30(&sStack_2a8.modulus,9,&SECP256K1_SIGNED30_ONE,-1);
    psVar19 = psStack_280;
    if (iVar4 == 0) {
LAB_0014b6c0:
      psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b6d5;
      secp256k1_modinv32_normalize_30
                ((secp256k1_modinv32_signed30 *)auStack_238,(int32_t)psVar20,unaff_R13);
      (psVar19->modulus).v[8] = auStack_238._32_4_;
      *(undefined8 *)((psVar19->modulus).v + 4) = auStack_238._16_8_;
      *(undefined8 *)((psVar19->modulus).v + 6) = auStack_238._24_8_;
      *(undefined8 *)(psVar19->modulus).v = auStack_238._0_8_;
      *(undefined8 *)((psVar19->modulus).v + 2) = auStack_238._8_8_;
      return auStack_238._32_4_;
    }
    psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b65c;
    iVar4 = secp256k1_modinv32_mul_cmp_30(&sStack_2a8.modulus,9,&SECP256K1_SIGNED30_ONE,1);
    if (iVar4 == 0) goto LAB_0014b6c0;
    uVar39 = 9;
    uVar25 = 0;
    psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b676;
    psVar30 = psVar19;
    iVar4 = secp256k1_modinv32_mul_cmp_30(&psVar19->modulus,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar4 == 0) {
      psVar30 = (secp256k1_modinv32_modinfo *)auStack_238;
      uVar39 = 9;
      uVar25 = 0;
      psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b699;
      iVar4 = secp256k1_modinv32_mul_cmp_30
                        ((secp256k1_modinv32_signed30 *)psVar30,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar4 == 0) {
        psVar30 = &sStack_2a8;
        uVar39 = 9;
        uVar25 = 1;
        psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b6b8;
        iVar4 = secp256k1_modinv32_mul_cmp_30(&psVar30->modulus,9,&unaff_R13->modulus,1);
        if (iVar4 == 0) goto LAB_0014b6c0;
      }
    }
  }
  else {
LAB_0014b74c:
    psStack_2e0 = (secp256k1_modinv32_modinfo *)0x14b751;
    secp256k1_modinv32_cold_6();
  }
  psStack_2e0 = (secp256k1_modinv32_modinfo *)secp256k1_modinv32_mul_cmp_30;
  secp256k1_modinv32_cold_7();
  a_01 = &sStack_330;
  piVar21 = (int *)(ulong)uVar25;
  pcStack_338 = (code *)0x14b776;
  psStack_2e8 = psVar20;
  psStack_2e0 = psVar19;
  secp256k1_modinv32_mul_30(&sStack_30c,&psVar30->modulus,uVar39,1);
  pcStack_338 = (code *)0x14b788;
  piVar38 = piVar21;
  psVar26 = a_00;
  secp256k1_modinv32_mul_30(&sStack_330,a_00,9,uVar25);
  lVar6 = 0;
  while ((uint)sStack_30c.v[lVar6] < 0x40000000) {
    if (0x3fffffff < (uint)sStack_330.v[lVar6]) goto LAB_0014b7da;
    lVar6 = lVar6 + 1;
    if (lVar6 == 8) {
      uVar25 = 8;
      while( true ) {
        if (sStack_30c.v[uVar25] < sStack_330.v[uVar25]) {
          return -1;
        }
        if (sStack_330.v[uVar25] < sStack_30c.v[uVar25]) break;
        bVar54 = uVar25 == 0;
        uVar25 = uVar25 - 1;
        if (bVar54) {
          return 0;
        }
      }
      return 1;
    }
  }
  pcStack_338 = (code *)0x14b7da;
  secp256k1_modinv32_mul_cmp_30_cold_2();
LAB_0014b7da:
  pcStack_338 = secp256k1_modinv32_update_fg_30_var;
  secp256k1_modinv32_mul_cmp_30_cold_1();
  iVar4 = (int)a_01;
  piStack_360 = piVar21;
  uStack_358 = uVar40;
  psStack_350 = unaff_R13;
  psStack_340 = psVar51;
  pcStack_338 = (code *)uVar23;
  if (iVar4 < 1) {
    psStack_370 = (secp256k1_modinv32_signed30 *)0x14b8cd;
    secp256k1_modinv32_update_fg_30_var_cold_3();
LAB_0014b8cd:
    iVar10 = (int)piVar38;
    psStack_370 = (secp256k1_modinv32_signed30 *)0x14b8d2;
    secp256k1_modinv32_update_fg_30_var_cold_1();
  }
  else {
    iVar9 = piVar38[1];
    iVar1 = *piVar38;
    piVar21 = (int *)(long)psVar26->v[0];
    uVar11 = (long)*extraout_RDX * (long)iVar9 + (long)piVar21 * (long)iVar1;
    if ((uVar11 & 0x3fffffff) != 0) goto LAB_0014b8cd;
    iVar2 = piVar38[3];
    iVar10 = piVar38[2];
    piVar21 = (int *)((long)piVar21 * (long)iVar10);
    piVar38 = (int *)((long)*extraout_RDX * (long)iVar2 + (long)piVar21);
    if (((ulong)piVar38 & 0x3fffffff) == 0) {
      lVar12 = (long)piVar38 >> 0x1e;
      lVar6 = (long)uVar11 >> 0x1e;
      if (iVar4 != 1) {
        uVar40 = 1;
        do {
          lVar6 = (long)extraout_RDX[uVar40] * (long)iVar9 +
                  (long)psVar26->v[uVar40] * (long)iVar1 + lVar6;
          lVar12 = (long)extraout_RDX[uVar40] * (long)iVar2 +
                   (long)psVar26->v[uVar40] * (long)iVar10 + lVar12;
          psVar26->v[uVar40 - 1] = (uint)lVar6 & 0x3fffffff;
          extraout_RDX[uVar40 - 1] = (uint)lVar12 & 0x3fffffff;
          uVar40 = uVar40 + 1;
          lVar12 = lVar12 >> 0x1e;
          lVar6 = lVar6 >> 0x1e;
        } while (((ulong)a_01 & 0xffffffff) != uVar40);
      }
      psVar26->v[(long)iVar4 + -1] = (int)lVar6;
      extraout_RDX[(long)iVar4 + -1] = (int)lVar12;
      return (int)lVar6;
    }
  }
  psStack_370 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_30;
  secp256k1_modinv32_update_fg_30_var_cold_2();
  lVar6 = 0;
  psStack_370 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar6 < extraout_EDX) {
      psStack_370 = (secp256k1_modinv32_signed30 *)
                    ((long)psStack_370->v + (long)psVar26->v[lVar6] * (long)iVar10);
    }
    a_01->v[lVar6] = (uint)psStack_370 & 0x3fffffff;
    psStack_370 = (secp256k1_modinv32_signed30 *)((long)psStack_370 >> 0x1e);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 8);
  if (8 < extraout_EDX) {
    psStack_370 = (secp256k1_modinv32_signed30 *)
                  ((long)psStack_370->v + (long)psVar26->v[8] * (long)iVar10);
  }
  iVar4 = (int)psStack_370;
  b = (secp256k1_modinv32_signed30 *)(long)iVar4;
  if (b == psStack_370) {
    a_01->v[8] = iVar4;
    return iVar4;
  }
  pcStack_378 = secp256k1_modinv32_update_de_30;
  secp256k1_modinv32_mul_30_cold_1();
  uVar25 = *extraout_RDX_00;
  psVar44 = (secp256k1_modinv32_signed30 *)(long)(int)uVar25;
  uVar34 = extraout_RDX_00[1];
  lVar6 = (long)(int)uVar34;
  uVar36 = extraout_RDX_00[2];
  psVar22 = (secp256k1_modinv32_signed30 *)(long)(int)uVar36;
  lStack_3b0 = (long)(int)extraout_RDX_00[3];
  psVar27 = (secp256k1_fe *)0x9;
  pcStack_3c0 = (code *)0x14b96c;
  a_02 = a_01;
  piStack_3a0 = piVar21;
  uStack_398 = uVar40;
  psStack_390 = unaff_R13;
  psStack_380 = psVar51;
  pcStack_378 = (code *)uVar23;
  iVar4 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
  if (iVar4 < 1) {
    pcStack_3c0 = (code *)0x14bbd4;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_0014bbd4:
    pcStack_3c0 = (code *)0x14bbd9;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_0014bbd9:
    pcStack_3c0 = (code *)0x14bbde;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_0014bbde:
    pcStack_3c0 = (code *)0x14bbe3;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_0014bbe3:
    pcStack_3c0 = (code *)0x14bbe8;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_0014bbe8:
    pcStack_3c0 = (code *)0x14bbed;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_0014bbed:
    pcStack_3c0 = (code *)0x14bbf2;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_0014bbf2:
    pcStack_3c0 = (code *)0x14bbf7;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar41 = b;
LAB_0014bbf7:
    pcStack_3c0 = (code *)0x14bbfc;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_0014bbfc:
    pcStack_3c0 = (code *)0x14bc01;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_0014bc01:
    pcStack_3c0 = (code *)0x14bc06;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar27 = (secp256k1_fe *)0x9;
    pcStack_3c0 = (code *)0x14b989;
    a_02 = a_01;
    iVar4 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar4) goto LAB_0014bbd4;
    psVar27 = (secp256k1_fe *)0x9;
    pcStack_3c0 = (code *)0x14b9a6;
    a_02 = psVar26;
    iVar4 = secp256k1_modinv32_mul_cmp_30(psVar26,9,b,-2);
    if (iVar4 < 1) goto LAB_0014bbd9;
    psVar27 = (secp256k1_fe *)0x9;
    pcStack_3c0 = (code *)0x14b9c3;
    a_02 = psVar26;
    iVar4 = secp256k1_modinv32_mul_cmp_30(psVar26,9,b,1);
    if (-1 < iVar4) goto LAB_0014bbde;
    psVar41 = (secp256k1_modinv32_signed30 *)-(long)psVar44;
    if (0 < (long)psVar44) {
      psVar41 = psVar44;
    }
    lVar12 = -lVar6;
    if (lVar6 < 1) {
      lVar12 = lVar6;
    }
    if (lVar12 + 0x40000000 < (long)psVar41) goto LAB_0014bbe3;
    psVar41 = (secp256k1_modinv32_signed30 *)-(long)psVar22;
    if (0 < (long)psVar22) {
      psVar41 = psVar22;
    }
    lVar12 = -lStack_3b0;
    if (lStack_3b0 < 1) {
      lVar12 = lStack_3b0;
    }
    if (lVar12 + 0x40000000 < (long)psVar41) goto LAB_0014bbe8;
    uVar39 = a_01->v[8] >> 0x1f;
    uVar3 = psVar26->v[8] >> 0x1f;
    psVar27 = (secp256k1_fe *)(ulong)uVar3;
    iVar4 = (uVar3 & uVar34) + (uVar39 & uVar25);
    a_02 = (secp256k1_modinv32_signed30 *)(psVar26->v[0] * lVar6 + (long)a_01->v[0] * (long)psVar44)
    ;
    lVar12 = (long)(int)(iVar4 - ((int)a_02 * b[1].v[0] + iVar4 & 0x3fffffffU));
    piVar14 = (int32_t *)((long)a_02->v + lVar12 * b->v[0]);
    if (((ulong)piVar14 & 0x3fffffff) != 0) goto LAB_0014bbed;
    lStack_3a8 = lVar12;
    iVar4 = (uVar3 & (uint)lStack_3b0) + (uVar39 & uVar36);
    lVar13 = psVar26->v[0] * lStack_3b0 + (long)a_01->v[0] * (long)psVar22;
    a_02 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar25 = iVar4 - (b[1].v[0] * (int)lVar13 + iVar4 & 0x3fffffffU);
    psVar27 = (secp256k1_fe *)(ulong)uVar25;
    uVar40 = (long)b->v[0] * (long)(int)uVar25 + lVar13;
    if ((uVar40 & 0x3fffffff) != 0) goto LAB_0014bbf2;
    lVar13 = (long)uVar40 >> 0x1e;
    lVar15 = (long)piVar14 >> 0x1e;
    lVar31 = 1;
    do {
      lVar15 = b->v[lVar31] * lVar12 + psVar26->v[lVar31] * lVar6 +
               (long)a_01->v[lVar31] * (long)psVar44 + lVar15;
      psVar41 = (secp256k1_modinv32_signed30 *)(psVar26->v[lVar31] * lStack_3b0);
      lVar13 = (long)psVar41->v +
               (long)a_01->v[lVar31] * (long)psVar22 + lVar13 +
               (long)b->v[lVar31] * (long)(int)uVar25;
      a_01->v[lVar31 + -1] = (uint)lVar15 & 0x3fffffff;
      psVar26->v[lVar31 + -1] = (uint)lVar13 & 0x3fffffff;
      lVar31 = lVar31 + 1;
      lVar13 = lVar13 >> 0x1e;
      lVar15 = lVar15 >> 0x1e;
    } while (lVar31 != 9);
    a_01->v[8] = (int32_t)lVar15;
    psVar26->v[8] = (int32_t)lVar13;
    psVar27 = (secp256k1_fe *)0x9;
    pcStack_3c0 = (code *)0x14bb6d;
    a_02 = a_01;
    iVar4 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
    psVar22 = psVar26;
    psVar44 = b;
    if (iVar4 < 1) goto LAB_0014bbf7;
    psVar27 = (secp256k1_fe *)0x9;
    pcStack_3c0 = (code *)0x14bb8a;
    a_02 = a_01;
    iVar4 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar4) goto LAB_0014bbfc;
    psVar27 = (secp256k1_fe *)0x9;
    pcStack_3c0 = (code *)0x14bba3;
    a_02 = psVar26;
    iVar4 = secp256k1_modinv32_mul_cmp_30(psVar26,9,b,-2);
    if (iVar4 < 1) goto LAB_0014bc01;
    psVar27 = (secp256k1_fe *)0x9;
    pcStack_3c0 = (code *)0x14bbbc;
    a_02 = psVar26;
    iVar4 = secp256k1_modinv32_mul_cmp_30(psVar26,9,b,1);
    if (iVar4 < 0) {
      return iVar4;
    }
  }
  pcStack_3c0 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  pcStack_3c0 = (code *)lVar6;
  psStack_3c8 = a_01;
  psStack_3d0 = psVar26;
  psStack_3d8 = psVar44;
  psStack_3e0 = psVar41;
  psStack_3e8 = psVar22;
  uVar25 = a_02->v[0];
  uVar28 = (ulong)uVar25;
  uVar34 = a_02->v[3];
  uVar16 = (ulong)uVar34;
  uVar36 = a_02->v[4];
  uVar11 = (ulong)uVar36;
  uVar3 = a_02->v[5];
  uVar23 = (ulong)uVar3;
  psVar26 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_02->v[6];
  uVar39 = a_02->v[7];
  uVar40 = (ulong)uVar39;
  iStack_3ec = a_02->v[8];
  lVar6 = 0;
  do {
    if (a_02->v[lVar6] < -0x3fffffff) {
      pcStack_428 = (code *)0x14bf54;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_0014bf54:
      pcStack_428 = (code *)0x14bf59;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_0014bf59;
    }
    if (0x3fffffff < a_02->v[lVar6]) goto LAB_0014bf54;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 9);
  uStack_40c = (uint)psVar27;
  psVar27 = (secp256k1_fe *)0x9;
  pcStack_428 = (code *)0x14bc91;
  psVar26 = a_02;
  uStack_418 = a_02->v[1];
  uStack_414 = a_02->v[2];
  uStack_410 = a_02->v[6];
  psStack_408 = b_00;
  iVar4 = secp256k1_modinv32_mul_cmp_30(a_02,9,b_00,-2);
  if (iVar4 < 1) {
LAB_0014bf59:
    pcStack_428 = (code *)0x14bf5e;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0014bf5e:
    pcStack_428 = (code *)0x14bf63;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_0014bf63:
    pcStack_428 = (code *)0x14bf68;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_0014bf68:
    pcStack_428 = (code *)0x14bf6d;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar27 = (secp256k1_fe *)0x9;
    pcStack_428 = (code *)0x14bcb0;
    psVar26 = a_02;
    iVar4 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_408,1);
    if (-1 < iVar4) goto LAB_0014bf5e;
    uVar8 = iStack_3ec >> 0x1f;
    uStack_3f0 = psStack_408->v[1];
    uVar42 = (uVar8 & uStack_3f0) + uStack_418;
    uStack_418 = psStack_408->v[2];
    uVar17 = (uVar8 & uStack_418) + uStack_414;
    uStack_414 = psStack_408->v[3];
    uStack_3f4 = psStack_408->v[4];
    uStack_3f8 = psStack_408->v[5];
    uStack_3fc = psStack_408->v[6];
    uVar18 = (uVar8 & uStack_3fc) + uStack_410;
    uStack_410 = psStack_408->v[7];
    uStack_41c = (int)uStack_40c >> 0x1f;
    uStack_40c = psStack_408->v[8];
    uVar49 = ((uVar8 & psStack_408->v[0]) + uVar25 ^ uStack_41c) - uStack_41c;
    uVar29 = ((int)uVar49 >> 0x1e) + ((uVar42 ^ uStack_41c) - uStack_41c);
    uVar42 = ((int)uVar29 >> 0x1e) + ((uVar17 ^ uStack_41c) - uStack_41c);
    uVar50 = ((int)uVar42 >> 0x1e) + (((uVar8 & uStack_414) + uVar34 ^ uStack_41c) - uStack_41c);
    uVar34 = ((int)uVar50 >> 0x1e) + (((uVar8 & uStack_3f4) + uVar36 ^ uStack_41c) - uStack_41c);
    uVar25 = ((int)uVar34 >> 0x1e) + (((uVar8 & uStack_3f8) + uVar3 ^ uStack_41c) - uStack_41c);
    uVar36 = ((int)uVar25 >> 0x1e) + ((uVar18 ^ uStack_41c) - uStack_41c);
    uVar3 = ((int)uVar36 >> 0x1e) + (((uVar8 & uStack_410) + uVar39 ^ uStack_41c) - uStack_41c);
    uVar46 = ((int)uVar3 >> 0x1e) + (((uVar8 & uStack_40c) + iStack_3ec ^ uStack_41c) - uStack_41c);
    uVar23 = (ulong)uVar46;
    uStack_420 = (int)uVar46 >> 0x1f;
    uVar18 = (psStack_408->v[0] & uStack_420) + (uVar49 & 0x3fffffff);
    uVar17 = (uStack_3f8 & uStack_420) + (uVar25 & 0x3fffffff);
    uVar28 = (ulong)uVar17;
    uVar49 = (uStack_3fc & uStack_420) + (uVar36 & 0x3fffffff);
    uVar16 = (ulong)uVar49;
    uVar25 = ((int)uVar18 >> 0x1e) + (uStack_3f0 & uStack_420) + (uVar29 & 0x3fffffff);
    uVar36 = ((int)uVar25 >> 0x1e) + (uStack_418 & uStack_420) + (uVar42 & 0x3fffffff);
    uVar39 = ((int)uVar36 >> 0x1e) + (uStack_414 & uStack_420) + (uVar50 & 0x3fffffff);
    uVar8 = ((int)uVar39 >> 0x1e) + (uStack_3f4 & uStack_420) + (uVar34 & 0x3fffffff);
    uVar17 = ((int)uVar8 >> 0x1e) + uVar17;
    uVar49 = ((int)uVar17 >> 0x1e) + uVar49;
    uVar34 = ((int)uVar49 >> 0x1e) + (uStack_410 & uStack_420) + (uVar3 & 0x3fffffff);
    uVar3 = ((int)uVar34 >> 0x1e) + (uStack_40c & uStack_420) + uVar46;
    uVar11 = (ulong)uVar3;
    uVar39 = uVar39 & 0x3fffffff;
    psVar27 = (secp256k1_fe *)(ulong)uVar39;
    uVar8 = uVar8 & 0x3fffffff;
    psVar26 = (secp256k1_modinv32_signed30 *)(ulong)uVar8;
    uVar34 = uVar34 & 0x3fffffff;
    uVar40 = (ulong)uVar34;
    a_02->v[0] = uVar18 & 0x3fffffff;
    a_02->v[1] = uVar25 & 0x3fffffff;
    a_02->v[2] = uVar36 & 0x3fffffff;
    a_02->v[3] = uVar39;
    a_02->v[4] = uVar8;
    a_02->v[5] = uVar17 & 0x3fffffff;
    a_02->v[6] = uVar49 & 0x3fffffff;
    a_02->v[7] = uVar34;
    a_02->v[8] = uVar3;
    if (0x3fffffff < uVar3) goto LAB_0014bf63;
    psVar27 = (secp256k1_fe *)0x9;
    pcStack_428 = (code *)0x14bf21;
    psVar26 = a_02;
    iVar4 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_408,0);
    if (iVar4 < 0) goto LAB_0014bf68;
    psVar27 = (secp256k1_fe *)0x9;
    pcStack_428 = (code *)0x14bf3c;
    psVar26 = a_02;
    iVar4 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_408,1);
    if (iVar4 < 0) {
      return iVar4;
    }
  }
  pcStack_428 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  psStack_4c0 = (secp256k1_fe *)secp256k1_fe_inv_var;
  if (extraout_EDX_00 == 0) {
    psStack_4c0 = (secp256k1_fe *)secp256k1_fe_inv;
  }
  pcStack_510 = (code *)0x14bfa9;
  uStack_450 = uVar40;
  uStack_448 = uVar23;
  uStack_440 = uVar16;
  psStack_438 = a_02;
  uStack_430 = uVar28;
  pcStack_428 = (code *)uVar11;
  (*(code *)psStack_4c0)(&sStack_4f8);
  if (psVar26 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar26->v + 8) = sStack_4f8.n[4];
    *(ulong *)(psVar26[1].v + 1) = CONCAT44(sStack_4f8.normalized,sStack_4f8.magnitude);
    *(uint64_t *)(psVar26->v + 4) = sStack_4f8.n[2];
    *(uint64_t *)(psVar26->v + 6) = sStack_4f8.n[3];
    *(uint64_t *)psVar26->v = sStack_4f8.n[0];
    *(uint64_t *)(psVar26->v + 2) = sStack_4f8.n[1];
  }
  uVar52 = 0xfffffffffffff;
  uVar45 = 0xf000000000000;
  uVar11 = 0xffffffffffff;
  uVar23 = 0x1000003d0;
  sStack_488.n[0] = psVar27->n[0];
  sStack_488.n[1] = psVar27->n[1];
  sStack_488.n[2] = psVar27->n[2];
  sStack_488.n[3] = psVar27->n[3];
  sStack_488.n[4] = psVar27->n[4];
  sStack_488.magnitude = psVar27->magnitude;
  sStack_488.normalized = psVar27->normalized;
  a_03 = &sStack_488;
  pcStack_510 = (code *)0x14c020;
  secp256k1_fe_verify(a_03);
  lStack_500 = 0x1000003d1;
  uVar40 = (sStack_488.n[4] >> 0x30) * 0x1000003d1 + sStack_488.n[0];
  if (((uVar40 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar40 & 0xfffffffffffff) == 0)) {
    uVar16 = (uVar40 >> 0x34) + sStack_488.n[1];
    uVar28 = (uVar16 >> 0x34) + sStack_488.n[2];
    uVar32 = (uVar28 >> 0x34) + sStack_488.n[3];
    uVar35 = (uVar32 >> 0x34) + (sStack_488.n[4] & 0xffffffffffff);
    if ((((uVar16 | uVar40 | uVar28 | uVar32) & 0xfffffffffffff) != 0 || uVar35 != 0) &&
       (((uVar40 | 0x1000003d0) & uVar16 & uVar28 & uVar32 & (uVar35 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0014c0c3;
LAB_0014c4d7:
    psVar27 = &sStack_4f8;
    pcStack_510 = (code *)0x14c4e4;
    secp256k1_fe_verify(psVar27);
    uVar11 = uVar11 & sStack_4f8.n[4];
    uVar40 = (sStack_4f8.n[4] >> 0x30) * lStack_500 + sStack_4f8.n[0];
    uVar16 = (uVar40 >> 0x34) + sStack_4f8.n[1];
    uVar28 = (uVar16 >> 0x34) + sStack_4f8.n[2];
    r = (secp256k1_fe *)((uVar28 >> 0x34) + sStack_4f8.n[3]);
    uVar32 = ((ulong)r >> 0x34) + uVar11;
    if (((uVar16 | uVar40 | uVar28 | (ulong)r) & uVar52) == 0 && uVar32 == 0) {
LAB_0014c54e:
      return (int)uVar40;
    }
    r_00 = (secp256k1_fe *)(uVar32 ^ uVar45);
    uVar40 = (uVar40 ^ uVar23) & uVar16 & uVar28 & (ulong)r & (ulong)r_00;
    if (uVar40 == uVar52) goto LAB_0014c54e;
  }
  else {
LAB_0014c0c3:
    pcStack_510 = (code *)0x14c0db;
    r = psVar27;
    secp256k1_fe_mul(&sStack_488,psVar27,&sStack_4f8);
    pcStack_510 = (code *)0x14c0e3;
    secp256k1_fe_verify(&sStack_488);
    r_00 = &fe_minus_one;
    pcStack_510 = (code *)0x14c0ef;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_488.magnitude < 0x20) {
      sStack_488.n[0] = sStack_488.n[0] + 0xffffefffffc2e;
      sStack_488.n[1] = sStack_488.n[1] + 0xfffffffffffff;
      sStack_488.n[2] = sStack_488.n[2] + 0xfffffffffffff;
      sStack_488.n[3] = sStack_488.n[3] + 0xfffffffffffff;
      sStack_488.n[4] = sStack_488.n[4] + 0xffffffffffff;
      sStack_488.normalized = 0;
      sStack_488.magnitude = sStack_488.magnitude + 1;
      pcStack_510 = (code *)0x14c144;
      secp256k1_fe_verify(&sStack_488);
      pcStack_510 = (code *)0x14c14c;
      secp256k1_fe_verify(&sStack_488);
      uVar40 = (sStack_488.n[4] >> 0x30) * lStack_500 + sStack_488.n[0];
      uVar11 = (uVar40 >> 0x34) + sStack_488.n[1];
      uVar16 = (uVar11 >> 0x34) + sStack_488.n[2];
      r = (secp256k1_fe *)((uVar16 >> 0x34) + sStack_488.n[3]);
      uVar28 = ((ulong)r >> 0x34) + (sStack_488.n[4] & 0xffffffffffff);
      if ((((uVar11 | uVar40 | uVar16 | (ulong)r) & 0xfffffffffffff) != 0 || uVar28 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar28 ^ 0xf000000000000),
         ((uVar40 ^ 0x1000003d0) & uVar11 & uVar16 & (ulong)r & (ulong)r_00) != 0xfffffffffffff))
      goto LAB_0014c565;
      sStack_4b8.n[0] = psVar27->n[0];
      sStack_4b8.n[1] = psVar27->n[1];
      sStack_4b8.n[2] = psVar27->n[2];
      sStack_4b8.n[3] = psVar27->n[3];
      sStack_4b8.n[4] = psVar27->n[4];
      sStack_4b8.magnitude = psVar27->magnitude;
      sStack_4b8.normalized = psVar27->normalized;
      psVar27 = &sStack_4b8;
      pcStack_510 = (code *)0x14c1e4;
      secp256k1_fe_verify(psVar27);
      r_00 = &fe_minus_one;
      pcStack_510 = (code *)0x14c1f0;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_4b8.magnitude) goto LAB_0014c56a;
      uVar24 = sStack_4b8.n[0] + 0xffffefffffc2e;
      uVar48 = sStack_4b8.n[1] + 0xfffffffffffff;
      uVar52 = sStack_4b8.n[2] + 0xfffffffffffff;
      uVar45 = sStack_4b8.n[3] + 0xfffffffffffff;
      uVar23 = sStack_4b8.n[4] + 0xffffffffffff;
      sStack_4b8.normalized = 0;
      sStack_4b8.magnitude = sStack_4b8.magnitude + 1;
      pcStack_510 = (code *)0x14c265;
      sStack_4b8.n[0] = uVar24;
      sStack_4b8.n[1] = uVar48;
      sStack_4b8.n[2] = uVar52;
      sStack_4b8.n[3] = uVar45;
      sStack_4b8.n[4] = uVar23;
      secp256k1_fe_verify(&sStack_4b8);
      pcStack_510 = (code *)0x14c26d;
      secp256k1_fe_verify(&sStack_4b8);
      a_03 = psStack_4c0;
      uVar40 = (uVar23 >> 0x30) * lStack_500 + uVar24;
      if (((uVar40 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar40 & 0xfffffffffffff) == 0)) {
        uVar23 = uVar23 & 0xffffffffffff;
        uVar32 = uVar48 + (uVar40 >> 0x34);
        uVar11 = (uVar32 >> 0x34) + uVar52;
        uVar16 = (uVar11 >> 0x34) + uVar45;
        uVar28 = (uVar16 >> 0x34) + uVar23;
        if ((((uVar32 | uVar40 | uVar11 | uVar16) & 0xfffffffffffff) == 0 && uVar28 == 0) ||
           (uVar40 = (uVar40 | 0x1000003d0) & uVar32 & uVar11 & uVar16 & (uVar28 ^ 0xf000000000000),
           uVar40 == 0xfffffffffffff)) goto LAB_0014c54e;
      }
      r = &sStack_4b8;
      pcStack_510 = (code *)0x14c32d;
      (*(code *)psStack_4c0)();
      psVar27 = &sStack_4f8;
      pcStack_510 = (code *)0x14c33a;
      secp256k1_fe_verify(psVar27);
      r_00 = &fe_minus_one;
      pcStack_510 = (code *)0x14c346;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_4f8.magnitude) goto LAB_0014c56f;
      psVar27 = &sStack_4f8;
      sStack_4f8.n[0] = sStack_4f8.n[0] + 0xffffefffffc2e;
      sStack_4f8.n[1] = sStack_4f8.n[1] + 0xfffffffffffff;
      sStack_4f8.n[2] = sStack_4f8.n[2] + 0xfffffffffffff;
      sStack_4f8.n[3] = sStack_4f8.n[3] + 0xfffffffffffff;
      sStack_4f8.n[4] = sStack_4f8.n[4] + 0xffffffffffff;
      sStack_4f8.magnitude = sStack_4f8.magnitude + 1;
      uVar11 = 0;
      sStack_4f8.normalized = 0;
      pcStack_510 = (code *)0x14c38f;
      secp256k1_fe_verify(psVar27);
      pcStack_510 = (code *)0x14c398;
      r = psVar27;
      (*(code *)a_03)(psVar27);
      pcStack_510 = (code *)0x14c3a0;
      secp256k1_fe_verify(psVar27);
      sStack_4f8.n[0] = sStack_4f8.n[0] + 1;
      sStack_4f8.magnitude = sStack_4f8.magnitude + 1;
      sStack_4f8.normalized = 0;
      pcStack_510 = (code *)0x14c3b1;
      secp256k1_fe_verify(psVar27);
      pcStack_510 = (code *)0x14c3b9;
      secp256k1_fe_verify(psVar27);
      a_03 = &sStack_4b8;
      pcStack_510 = (code *)0x14c3c6;
      r_00 = a_03;
      secp256k1_fe_verify(a_03);
      if (sStack_4b8.magnitude + sStack_4f8.magnitude < 0x21) {
        sStack_4f8.n[0] = sStack_4f8.n[0] + sStack_4b8.n[0];
        sStack_4f8.n[1] = sStack_4f8.n[1] + sStack_4b8.n[1];
        sStack_4f8.n[2] = sStack_4f8.n[2] + sStack_4b8.n[2];
        sStack_4f8.n[3] = sStack_4f8.n[3] + sStack_4b8.n[3];
        sStack_4f8.n[4] = sStack_4f8.n[4] + sStack_4b8.n[4];
        sStack_4f8.normalized = 0;
        pcStack_510 = (code *)0x14c414;
        sStack_4f8.magnitude = sStack_4b8.magnitude + sStack_4f8.magnitude;
        secp256k1_fe_verify(&sStack_4f8);
        pcStack_510 = (code *)0x14c41c;
        secp256k1_fe_verify(&sStack_4f8);
        uVar40 = (sStack_4f8.n[4] >> 0x30) * lStack_500 + sStack_4f8.n[0];
        if (((uVar40 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar40 & 0xfffffffffffff) == 0)) {
          uVar16 = (uVar40 >> 0x34) + sStack_4f8.n[1];
          uVar28 = (uVar16 >> 0x34) + sStack_4f8.n[2];
          uVar32 = (uVar28 >> 0x34) + sStack_4f8.n[3];
          uVar35 = (uVar32 >> 0x34) + (sStack_4f8.n[4] & 0xffffffffffff);
          if ((((uVar16 | uVar40 | uVar28 | uVar32) & 0xfffffffffffff) == 0 && uVar35 == 0) ||
             (uVar40 = (uVar40 | 0x1000003d0) & uVar16 & uVar28 & uVar32 &
                       (uVar35 ^ 0xf000000000000), uVar40 == 0xfffffffffffff)) goto LAB_0014c54e;
        }
        pcStack_510 = (code *)0x14c4d7;
        test_inverse_field_cold_2();
        goto LAB_0014c4d7;
      }
    }
    else {
      pcStack_510 = (code *)0x14c565;
      test_inverse_field_cold_7();
LAB_0014c565:
      pcStack_510 = (code *)0x14c56a;
      test_inverse_field_cold_6();
LAB_0014c56a:
      a_03 = &sStack_488;
      pcStack_510 = (code *)0x14c56f;
      test_inverse_field_cold_5();
LAB_0014c56f:
      uVar11 = 0xffffffffffff;
      pcStack_510 = (code *)0x14c574;
      test_inverse_field_cold_4();
    }
    pcStack_510 = (code *)0x14c579;
    test_inverse_field_cold_3();
  }
  pcStack_510 = test_inverse_scalar;
  test_inverse_field_cold_1();
  psVar33 = (secp256k1_fe *)auStack_580;
  pcVar53 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_01 == 0) {
    pcVar53 = secp256k1_scalar_inverse;
  }
  pcStack_588 = (code *)0x14c5a7;
  auStack_540._32_8_ = psVar27;
  auStack_540._40_8_ = a_03;
  pcStack_510 = (code *)uVar52;
  (*pcVar53)(auStack_580);
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_580._20_4_,auStack_580._16_4_);
    r_00->n[3] = CONCAT44(auStack_580._28_4_,auStack_580._24_4_);
    r_00->n[0] = CONCAT44(auStack_580._4_4_,auStack_580._0_4_);
    r_00->n[1] = CONCAT44(auStack_580._12_4_,auStack_580._8_4_);
  }
  pcStack_588 = (code *)0x14c5c6;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  auVar58._0_4_ = -(uint)((int)r->n[2] == 0 && (int)r->n[0] == 0);
  auVar58._4_4_ = -(uint)(*(int *)((long)r->n + 0x14) == 0 && *(int *)((long)r->n + 4) == 0);
  auVar58._8_4_ = -(uint)((int)r->n[3] == 0 && (int)r->n[1] == 0);
  auVar58._12_4_ = -(uint)(*(int *)((long)r->n + 0x1c) == 0 && *(int *)((long)r->n + 0xc) == 0);
  iVar4 = movmskps(extraout_EAX,auVar58);
  if (iVar4 != 0xf) {
    r_00 = (secp256k1_fe *)auStack_540;
    pcStack_588 = (code *)0x14c5fa;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)auStack_580);
    pcStack_588 = (code *)0x14c602;
    psVar27 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (((auStack_540._0_8_ != 1 || auStack_540._8_8_ != 0) || auStack_540._16_8_ != 0) ||
        auStack_540._24_8_ != 0) {
      pcStack_588 = (code *)0x14c70c;
      test_inverse_scalar_cold_1();
      goto LAB_0014c70c;
    }
    pcStack_588 = (code *)0x14c632;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_580 + 0x20),(secp256k1_scalar *)r,&scalar_minus_one);
    pcStack_588 = (code *)0x14c63a;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_580 + 0x20));
    auVar55._0_4_ = -(uint)(iStack_550 == 0 && auStack_580._32_4_ == 0);
    auVar55._4_4_ = -(uint)(iStack_54c == 0 && iStack_55c == 0);
    auVar55._8_4_ = -(uint)(iStack_548 == 0 && iStack_558 == 0);
    auVar55._12_4_ = -(uint)(iStack_544 == 0 && iStack_554 == 0);
    uVar25 = movmskps(extraout_EAX_00,auVar55);
    if (uVar25 == 0xf) {
      return 0;
    }
    a = (secp256k1_scalar *)(auStack_580 + 0x20);
    pcStack_588 = (code *)0x14c66b;
    (*pcVar53)(a,a);
    pcStack_588 = (code *)0x14c680;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_580,&scalar_minus_one,(secp256k1_scalar *)auStack_580);
    pcStack_588 = (code *)0x14c689;
    (*pcVar53)(auStack_580,auStack_580);
    pcStack_588 = (code *)0x14c69b;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_580,(secp256k1_scalar *)auStack_580,&secp256k1_scalar_one
              );
    pcStack_588 = (code *)0x14c6a9;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_580,a,(secp256k1_scalar *)auStack_580);
    pcStack_588 = (code *)0x14c6b1;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_580);
    auVar56._0_4_ = -(uint)(auStack_580._16_4_ == 0 && auStack_580._0_4_ == 0);
    auVar56._4_4_ = -(uint)(auStack_580._20_4_ == 0 && auStack_580._4_4_ == 0);
    auVar56._8_4_ = -(uint)(auStack_580._24_4_ == 0 && auStack_580._8_4_ == 0);
    auVar56._12_4_ = -(uint)(auStack_580._28_4_ == 0 && auStack_580._12_4_ == 0);
    uVar25 = movmskps(extraout_EAX_01,auVar56);
    if (uVar25 == 0xf) {
      return 0;
    }
    pcStack_588 = (code *)0x14c6d5;
    test_inverse_scalar_cold_2();
    r_00 = (secp256k1_fe *)auStack_580;
  }
  pcStack_588 = (code *)0x14c6e0;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_580);
  auVar57._0_4_ = -(uint)(auStack_580._16_4_ == 0 && auStack_580._0_4_ == 0);
  auVar57._4_4_ = -(uint)(auStack_580._20_4_ == 0 && auStack_580._4_4_ == 0);
  auVar57._8_4_ = -(uint)(auStack_580._24_4_ == 0 && auStack_580._8_4_ == 0);
  auVar57._12_4_ = -(uint)(auStack_580._28_4_ == 0 && auStack_580._12_4_ == 0);
  uVar25 = movmskps(extraout_EAX_02,auVar57);
  r = (secp256k1_fe *)auStack_580;
  psVar27 = psVar33;
  if (uVar25 == 0xf) {
    return 0;
  }
LAB_0014c70c:
  pcStack_588 = test_hsort;
  test_inverse_scalar_cold_3();
  __s = auStack_1638;
  psStack_5b0 = r;
  uStack_5a8 = uVar23;
  uStack_5a0 = uVar45;
  psStack_598 = r_00;
  pcStack_590 = pcVar53;
  pcStack_588 = (code *)uVar11;
  memset(__s,0,0x1081);
  uStack_1648 = 0;
  lVar6 = 0x41;
  psStack_1640 = psVar27;
  secp256k1_hsort(__s,0x41,(size_t)psVar27,test_hsort_cmp,&uStack_1648);
  if (0x3f < uStack_1648) {
    test_hsort_is_sorted(auStack_1638,0x41,(size_t)psVar27);
    iVar4 = extraout_EAX_03;
    if (0 < COUNT) {
      iVar9 = 0;
      do {
        uVar5 = testrand_int(0x41);
        count = (size_t)(int)uVar5;
        testrand_bytes_test(auStack_1638,count * (long)psVar27);
        secp256k1_hsort(auStack_1638,count,(size_t)psVar27,test_hsort_cmp,&uStack_1648);
        test_hsort_is_sorted(auStack_1638,count,(size_t)psVar27);
        iVar9 = iVar9 + 1;
        iVar4 = extraout_EAX_04;
      } while (iVar9 < COUNT);
    }
    return iVar4;
  }
  test_hsort_cold_1();
  *extraout_RDX_01 = *extraout_RDX_01 + 1;
  if (extraout_RDX_01[1] != 0) {
    lVar12 = 0;
    do {
      iVar4 = (uint)__s[lVar12] - (uint)*(byte *)(lVar6 + lVar12);
      if (iVar4 != 0) {
        return iVar4;
      }
      lVar12 = lVar12 + 1;
    } while (extraout_RDX_01[1] != lVar12);
  }
  return 0;
}

Assistant:

static int secp256k1_jacobi32_maybe_var(const secp256k1_modinv32_signed30 *x, const secp256k1_modinv32_modinfo *modinfo) {
    /* Start with f=modulus, g=x, eta=-1. */
    secp256k1_modinv32_signed30 f = modinfo->modulus;
    secp256k1_modinv32_signed30 g = *x;
    int j, len = 9;
    int32_t eta = -1; /* eta = -delta; delta is initially 1 */
    int32_t cond, fn, gn;
    int jac = 0;
    int count;

    /* The input limbs must all be non-negative. */
    VERIFY_CHECK(g.v[0] >= 0 && g.v[1] >= 0 && g.v[2] >= 0 && g.v[3] >= 0 && g.v[4] >= 0 && g.v[5] >= 0 && g.v[6] >= 0 && g.v[7] >= 0 && g.v[8] >= 0);

    /* If x > 0, then if the loop below converges, it converges to f=g=gcd(x,modulus). Since we
     * require that gcd(x,modulus)=1 and modulus>=3, x cannot be 0. Thus, we must reach f=1 (or
     * time out). */
    VERIFY_CHECK((g.v[0] | g.v[1] | g.v[2] | g.v[3] | g.v[4] | g.v[5] | g.v[6] | g.v[7] | g.v[8]) != 0);

    for (count = 0; count < JACOBI32_ITERATIONS; ++count) {
        /* Compute transition matrix and new eta after 30 posdivsteps. */
        secp256k1_modinv32_trans2x2 t;
        eta = secp256k1_modinv32_posdivsteps_30_var(eta, f.v[0] | ((uint32_t)f.v[1] << 30), g.v[0] | ((uint32_t)g.v[1] << 30), &t, &jac);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */

        secp256k1_modinv32_update_fg_30_var(len, &f, &g, &t);
        /* If the bottom limb of f is 1, there is a chance that f=1. */
        if (f.v[0] == 1) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= f.v[j];
            }
            /* If so, we're done. If f=1, the Jacobi symbol (g | f)=1. */
            if (cond == 0) return 1 - 2*(jac & 1);
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int32_t)len - 2) >> 31;
        cond |= fn;
        cond |= gn;
        /* If so, reduce length. */
        if (cond == 0) --len;

        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */
    }

    /* The loop failed to converge to f=g after 1500 iterations. Return 0, indicating unknown result. */
    return 0;
}